

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFArrayBox.cpp
# Opt level: O0

void __thiscall
amrex::EBFArrayBox::EBFArrayBox
          (EBFArrayBox *this,EBCellFlagFab *ebflag,Box *bx,int ncomps,Arena *ar,
          EBFArrayBoxFactory *factory,int box_index)

{
  uint uVar1;
  undefined8 uVar2;
  FabType FVar3;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  Box bx_1;
  Box *ccbx;
  int i;
  Arena *in_stack_ffffffffffffff38;
  Box *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined8 local_a4;
  undefined8 local_9c;
  undefined4 local_94;
  undefined1 *local_90;
  undefined8 local_88;
  long local_70;
  undefined8 local_68;
  long local_58;
  int local_4c;
  undefined1 *local_48;
  int local_3c;
  undefined4 *local_38;
  undefined4 local_30;
  int local_2c;
  long local_28;
  undefined4 *local_20;
  int local_14;
  undefined4 *local_10;
  int local_4;
  
  local_88 = in_R9;
  local_70 = in_RDX;
  local_68 = in_RSI;
  FArrayBox::FArrayBox
            ((FArrayBox *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff38);
  *in_RDI = &PTR__EBFArrayBox_01aa4cb8;
  in_RDI[9] = local_68;
  in_RDI[10] = local_88;
  *(undefined4 *)(in_RDI + 0xb) = in_stack_00000008;
  local_58 = local_70;
  local_a4 = *(undefined8 *)(local_70 + 8);
  uVar2 = *(undefined8 *)(local_70 + 0x10);
  uVar1 = *(uint *)(local_70 + 0x18);
  local_48 = &stack0xffffffffffffff54;
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    local_38 = &local_94;
    local_3c = local_4c;
    local_14 = local_4c;
    local_4 = local_4c;
    if ((uVar1 & 1 << ((byte)local_4c & 0x1f)) != 0) {
      local_28 = (long)&local_a4 + 4;
      local_2c = local_4c;
      local_30 = 0xffffffff;
      *(int *)(local_28 + (long)local_4c * 4) = *(int *)(local_28 + (long)local_4c * 4) + -1;
    }
    local_10 = local_38;
  }
  local_20 = &local_94;
  local_94 = 0;
  local_90 = &stack0xffffffffffffff54;
  local_9c = uVar2;
  FVar3 = EBCellFlagFab::getType((EBCellFlagFab *)this,(Box *)ebflag);
  *(FabType *)((long)in_RDI + 0x44) = FVar3;
  return;
}

Assistant:

EBFArrayBox::EBFArrayBox (const EBCellFlagFab& ebflag, const Box& bx, int ncomps, Arena* ar,
                          const EBFArrayBoxFactory* factory, int box_index)
    : FArrayBox(bx, ncomps, ar),
      m_ebcellflag(&ebflag),
      m_factory(factory),
      m_box_index(box_index)
{
    BL_ASSERT(ebflag.box().contains(amrex::enclosedCells(bx)));
    const Box& ccbx = amrex::enclosedCells(bx);
    m_type = ebflag.getType(ccbx);
}